

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

void __thiscall flatbuffers::Parser::ParseAnyValue(Parser *this,Value *val,FieldDef *field)

{
  pointer ppVar1;
  byte bVar2;
  Offset<flatbuffers::String> t;
  uint t_00;
  StructDef *struct_def;
  undefined8 extraout_RAX;
  string s;
  string local_38;
  
  switch((val->type).base_type) {
  case BASE_TYPE_STRING:
    std::__cxx11::string::string((string *)&s,(string *)&this->attribute_);
    Expect(this,1);
    t = FlatBufferBuilder::CreateString(&this->builder_,&s);
    NumToString<unsigned_int>(&local_38,t.o);
    std::__cxx11::string::operator=((string *)&val->constant,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    goto LAB_0011181b;
  case BASE_TYPE_VECTOR:
    Expect(this,0x5b);
    local_38._M_dataplus._M_p._0_4_ = (val->type).element;
    local_38._M_string_length = (size_type)(val->type).struct_def;
    local_38._M_dataplus._M_p._4_4_ = 0;
    local_38.field_2._M_allocated_capacity = 0;
    t_00 = ParseVector(this,(Type *)&local_38);
    goto LAB_001117fc;
  case BASE_TYPE_STRUCT:
    struct_def = (val->type).struct_def;
    break;
  case BASE_TYPE_UNION:
    if (field == (FieldDef *)0x0) {
LAB_0011185b:
      __assert_fail("field",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/AlexStocks[P]flatbuffers/src/idl_parser.cpp"
                    ,0x14e,"void flatbuffers::Parser::ParseAnyValue(Value &, FieldDef *)");
    }
    ppVar1 = (this->field_stack_).
             super__Vector_base<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((ppVar1 == (this->field_stack_).
                   super__Vector_base<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) ||
       (((ppVar1[-1].second)->value).type.base_type != BASE_TYPE_UTYPE)) {
      std::operator+(&s,"missing type field before this union value: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)field);
      Error(&s);
      goto LAB_0011185b;
    }
    bVar2 = atot<unsigned_char>(ppVar1[-1].first.constant._M_dataplus._M_p);
    struct_def = EnumDef::ReverseLookup((val->type).enum_def,(uint)bVar2);
    if (struct_def == (StructDef *)0x0) {
      std::operator+(&s,"illegal type id for: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)field);
      Error(&s);
      std::__cxx11::string::~string((string *)&s);
      _Unwind_Resume(extraout_RAX);
    }
    break;
  default:
    ParseSingleValue(this,val);
    return;
  }
  t_00 = ParseTable(this,struct_def);
LAB_001117fc:
  NumToString<unsigned_int>(&s,t_00);
  std::__cxx11::string::operator=((string *)&val->constant,(string *)&s);
LAB_0011181b:
  std::__cxx11::string::~string((string *)&s);
  return;
}

Assistant:

void Parser::ParseAnyValue(Value &val, FieldDef *field) {
  switch (val.type.base_type) {
    case BASE_TYPE_UNION: {
      assert(field);
      if (!field_stack_.size() ||
          field_stack_.back().second->value.type.base_type != BASE_TYPE_UTYPE)
        Error("missing type field before this union value: " + field->name);
      auto enum_idx = atot<unsigned char>(
                                    field_stack_.back().first.constant.c_str());
      auto struct_def = val.type.enum_def->ReverseLookup(enum_idx);
      if (!struct_def) Error("illegal type id for: " + field->name);
      val.constant = NumToString(ParseTable(*struct_def));
      break;
    }
    case BASE_TYPE_STRUCT:
      val.constant = NumToString(ParseTable(*val.type.struct_def));
      break;
    case BASE_TYPE_STRING: {
      auto s = attribute_;
      Expect(kTokenStringConstant);
      val.constant = NumToString(builder_.CreateString(s).o);
      break;
    }
    case BASE_TYPE_VECTOR: {
      Expect('[');
      val.constant = NumToString(ParseVector(val.type.VectorType()));
      break;
    }
    default:
      ParseSingleValue(val);
      break;
  }
}